

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O1

void __thiscall vec<vec<IntVar_*>_>::reserve(vec<vec<IntVar_*>_> *this,uint size)

{
  uint uVar1;
  void *pvVar2;
  
  if (*(uint *)(this + 4) < size) {
    if (*(uint *)(this + 4) == 0) {
      uVar1 = 2;
      if (2 < size) {
        uVar1 = size;
      }
    }
    else {
      uVar1 = *(uint *)(this + 4);
      do {
        uVar1 = uVar1 * 3 + 1 >> 1;
      } while (uVar1 < size);
    }
    *(uint *)(this + 4) = uVar1;
    pvVar2 = realloc(*(void **)(this + 8),(ulong)uVar1 << 4);
    *(void **)(this + 8) = pvVar2;
  }
  return;
}

Assistant:

void reserve(unsigned int size) {
		if (size > cap) {
			if (cap == 0) {
				cap = (size > 2) ? size : 2;
			} else {
				do {
					cap = (cap * 3 + 1) >> 1;
				} while (cap < size);
			}
			data = (T*)realloc((char*)data, cap * sizeof(T));
		}
	}